

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-summon.c
# Opt level: O2

parser_error parse_summon_message_type(parser *p)

{
  int iVar1;
  parser_error pVar2;
  void *pvVar3;
  char *name;
  
  pvVar3 = parser_priv(p);
  if (pvVar3 != (void *)0x0) {
    name = parser_getsym(p,"type");
    iVar1 = message_lookup_by_name(name);
    if (iVar1 < 0) {
      pVar2 = PARSE_ERROR_INVALID_MESSAGE;
    }
    else {
      *(int *)((long)pvVar3 + 0x10) = iVar1;
      pVar2 = PARSE_ERROR_NONE;
    }
    return pVar2;
  }
  __assert_fail("s",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-summon.c"
                ,0x4d,"enum parser_error parse_summon_message_type(struct parser *)");
}

Assistant:

static enum parser_error parse_summon_message_type(struct parser *p) {
	struct summon *s = parser_priv(p);
	int msg_index;
	const char *type;
	assert(s);
	type = parser_getsym(p, "type");
	msg_index = message_lookup_by_name(type);

	if (msg_index < 0)
		return PARSE_ERROR_INVALID_MESSAGE;

	s->message_type = msg_index;
	return PARSE_ERROR_NONE;
}